

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

TriggerPrg * codeRowTrigger(Parse *pParse,Trigger *pTrigger,Table *pTab,int orconf)

{
  sqlite3 *db_00;
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  int iVar4;
  Vdbe *p;
  Parse *pParse_00;
  Vdbe *p_00;
  char *zP4;
  Expr *pExpr;
  sqlite3 *psVar5;
  Parse *local_b0;
  int local_a4;
  int iEndTrigger;
  Parse *pSubParse;
  SubProgram *pProgram;
  NameContext sNC;
  Vdbe *v;
  Expr *pWhen;
  TriggerPrg *pPrg;
  sqlite3 *db;
  Parse *pTop;
  int orconf_local;
  Table *pTab_local;
  Trigger *pTrigger_local;
  Parse *pParse_local;
  
  local_b0 = pParse;
  if (pParse->pToplevel != (Parse *)0x0) {
    local_b0 = pParse->pToplevel;
  }
  db_00 = pParse->db;
  local_a4 = 0;
  pParse_local = (Parse *)sqlite3DbMallocZero(db_00,0x28);
  if (pParse_local == (Parse *)0x0) {
    pParse_local = (Parse *)0x0;
  }
  else {
    pParse_local->zErrMsg = (char *)local_b0->pTriggerPrg;
    local_b0->pTriggerPrg = (TriggerPrg *)pParse_local;
    p = (Vdbe *)sqlite3DbMallocZero(db_00,0x30);
    pParse_local->pVdbe = p;
    if (p == (Vdbe *)0x0) {
      pParse_local = (Parse *)0x0;
    }
    else {
      sqlite3VdbeLinkSubProgram(local_b0->pVdbe,(SubProgram *)p);
      pParse_local->db = (sqlite3 *)pTrigger;
      pParse_local->rc = orconf;
      *(u32 *)&pParse_local->colNamesSet = 0xffffffff;
      pParse_local->isMultiWrite = 0xff;
      pParse_local->mayAbort = 0xff;
      pParse_local->hasCompound = 0xff;
      pParse_local->okConstFactor = 0xff;
      pParse_00 = (Parse *)sqlite3DbMallocZero(db_00,0x1a0);
      if (pParse_00 == (Parse *)0x0) {
        pParse_local = (Parse *)0x0;
      }
      else {
        memset(&pProgram,0,0x38);
        pParse_00->db = db_00;
        pParse_00->pTriggerTab = pTab;
        pParse_00->pToplevel = local_b0;
        pParse_00->zAuthContext = pTrigger->zName;
        pParse_00->eTriggerOp = pTrigger->op;
        pParse_00->nQueryLoop = pParse->nQueryLoop;
        pParse_00->disableVtab = pParse->disableVtab;
        pProgram = (SubProgram *)pParse_00;
        p_00 = sqlite3GetVdbe(pParse_00);
        sNC.pWinSelect = (Select *)p_00;
        if (p_00 != (Vdbe *)0x0) {
          if (pTrigger->zName != (char *)0x0) {
            zP4 = sqlite3MPrintf(db_00,"-- TRIGGER %s",pTrigger->zName);
            sqlite3VdbeChangeP4(p_00,-1,zP4,-7);
          }
          if (pTrigger->pWhen != (Expr *)0x0) {
            pExpr = sqlite3ExprDup(db_00,pTrigger->pWhen,0);
            iVar4 = sqlite3ResolveExprNames((NameContext *)&pProgram,pExpr);
            if ((iVar4 == 0) && (db_00->mallocFailed == '\0')) {
              local_a4 = sqlite3VdbeMakeLabel(pParse_00);
              sqlite3ExprIfFalse(pParse_00,pExpr,local_a4,0x10);
            }
            sqlite3ExprDelete(db_00,pExpr);
          }
          codeTriggerProgram(pParse_00,pTrigger->step_list,orconf);
          if (local_a4 != 0) {
            sqlite3VdbeResolveLabel((Vdbe *)sNC.pWinSelect,local_a4);
          }
          sqlite3VdbeAddOp0((Vdbe *)sNC.pWinSelect,0x45);
          transferParseError(pParse,pParse_00);
          if ((db_00->mallocFailed == '\0') && (pParse->nErr == 0)) {
            psVar5 = (sqlite3 *)
                     sqlite3VdbeTakeOpArray
                               ((Vdbe *)sNC.pWinSelect,(int *)&p->pPrev,&local_b0->nMaxArg);
            p->db = psVar5;
          }
          *(int *)((long)&p->pPrev + 4) = pParse_00->nMem;
          *(int *)&p->pNext = pParse_00->nTab;
          *(Trigger **)&p->nVar = pTrigger;
          *(u32 *)&pParse_local->colNamesSet = pParse_00->oldmask;
          uVar1 = *(undefined1 *)((long)&pParse_00->newmask + 1);
          uVar2 = *(undefined1 *)((long)&pParse_00->newmask + 2);
          uVar3 = *(undefined1 *)((long)&pParse_00->newmask + 3);
          pParse_local->isMultiWrite = *(undefined1 *)&pParse_00->newmask;
          pParse_local->mayAbort = uVar1;
          pParse_local->hasCompound = uVar2;
          pParse_local->okConstFactor = uVar3;
          sqlite3VdbeDelete((Vdbe *)sNC.pWinSelect);
        }
        sqlite3ParserReset(pParse_00);
        sqlite3DbFree(db_00,pParse_00);
      }
    }
  }
  return (TriggerPrg *)pParse_local;
}

Assistant:

static TriggerPrg *codeRowTrigger(
  Parse *pParse,       /* Current parse context */
  Trigger *pTrigger,   /* Trigger to code */
  Table *pTab,         /* The table pTrigger is attached to */
  int orconf           /* ON CONFLICT policy to code trigger program with */
){
  Parse *pTop = sqlite3ParseToplevel(pParse);
  sqlite3 *db = pParse->db;   /* Database handle */
  TriggerPrg *pPrg;           /* Value to return */
  Expr *pWhen = 0;            /* Duplicate of trigger WHEN expression */
  Vdbe *v;                    /* Temporary VM */
  NameContext sNC;            /* Name context for sub-vdbe */
  SubProgram *pProgram = 0;   /* Sub-vdbe for trigger program */
  Parse *pSubParse;           /* Parse context for sub-vdbe */
  int iEndTrigger = 0;        /* Label to jump to if WHEN is false */

  assert( pTrigger->zName==0 || pTab==tableOfTrigger(pTrigger) );
  assert( pTop->pVdbe );

  /* Allocate the TriggerPrg and SubProgram objects. To ensure that they
  ** are freed if an error occurs, link them into the Parse.pTriggerPrg 
  ** list of the top-level Parse object sooner rather than later.  */
  pPrg = sqlite3DbMallocZero(db, sizeof(TriggerPrg));
  if( !pPrg ) return 0;
  pPrg->pNext = pTop->pTriggerPrg;
  pTop->pTriggerPrg = pPrg;
  pPrg->pProgram = pProgram = sqlite3DbMallocZero(db, sizeof(SubProgram));
  if( !pProgram ) return 0;
  sqlite3VdbeLinkSubProgram(pTop->pVdbe, pProgram);
  pPrg->pTrigger = pTrigger;
  pPrg->orconf = orconf;
  pPrg->aColmask[0] = 0xffffffff;
  pPrg->aColmask[1] = 0xffffffff;

  /* Allocate and populate a new Parse context to use for coding the 
  ** trigger sub-program.  */
  pSubParse = sqlite3StackAllocZero(db, sizeof(Parse));
  if( !pSubParse ) return 0;
  memset(&sNC, 0, sizeof(sNC));
  sNC.pParse = pSubParse;
  pSubParse->db = db;
  pSubParse->pTriggerTab = pTab;
  pSubParse->pToplevel = pTop;
  pSubParse->zAuthContext = pTrigger->zName;
  pSubParse->eTriggerOp = pTrigger->op;
  pSubParse->nQueryLoop = pParse->nQueryLoop;
  pSubParse->disableVtab = pParse->disableVtab;

  v = sqlite3GetVdbe(pSubParse);
  if( v ){
    VdbeComment((v, "Start: %s.%s (%s %s%s%s ON %s)", 
      pTrigger->zName, onErrorText(orconf),
      (pTrigger->tr_tm==TRIGGER_BEFORE ? "BEFORE" : "AFTER"),
        (pTrigger->op==TK_UPDATE ? "UPDATE" : ""),
        (pTrigger->op==TK_INSERT ? "INSERT" : ""),
        (pTrigger->op==TK_DELETE ? "DELETE" : ""),
      pTab->zName
    ));
#ifndef SQLITE_OMIT_TRACE
    if( pTrigger->zName ){
      sqlite3VdbeChangeP4(v, -1, 
        sqlite3MPrintf(db, "-- TRIGGER %s", pTrigger->zName), P4_DYNAMIC
      );
    }
#endif

    /* If one was specified, code the WHEN clause. If it evaluates to false
    ** (or NULL) the sub-vdbe is immediately halted by jumping to the 
    ** OP_Halt inserted at the end of the program.  */
    if( pTrigger->pWhen ){
      pWhen = sqlite3ExprDup(db, pTrigger->pWhen, 0);
      if( SQLITE_OK==sqlite3ResolveExprNames(&sNC, pWhen) 
       && db->mallocFailed==0 
      ){
        iEndTrigger = sqlite3VdbeMakeLabel(pSubParse);
        sqlite3ExprIfFalse(pSubParse, pWhen, iEndTrigger, SQLITE_JUMPIFNULL);
      }
      sqlite3ExprDelete(db, pWhen);
    }

    /* Code the trigger program into the sub-vdbe. */
    codeTriggerProgram(pSubParse, pTrigger->step_list, orconf);

    /* Insert an OP_Halt at the end of the sub-program. */
    if( iEndTrigger ){
      sqlite3VdbeResolveLabel(v, iEndTrigger);
    }
    sqlite3VdbeAddOp0(v, OP_Halt);
    VdbeComment((v, "End: %s.%s", pTrigger->zName, onErrorText(orconf)));

    transferParseError(pParse, pSubParse);
    if( db->mallocFailed==0 && pParse->nErr==0 ){
      pProgram->aOp = sqlite3VdbeTakeOpArray(v, &pProgram->nOp, &pTop->nMaxArg);
    }
    pProgram->nMem = pSubParse->nMem;
    pProgram->nCsr = pSubParse->nTab;
    pProgram->token = (void *)pTrigger;
    pPrg->aColmask[0] = pSubParse->oldmask;
    pPrg->aColmask[1] = pSubParse->newmask;
    sqlite3VdbeDelete(v);
  }

  assert( !pSubParse->pAinc       && !pSubParse->pZombieTab );
  assert( !pSubParse->pTriggerPrg && !pSubParse->nMaxArg );
  sqlite3ParserReset(pSubParse);
  sqlite3StackFree(db, pSubParse);

  return pPrg;
}